

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereClauseClear(WhereClause *pWC)

{
  sqlite3 *db_00;
  long in_RDI;
  WhereTerm *aLast;
  WhereTerm *a;
  sqlite3 *db;
  WhereOrInfo *in_stack_ffffffffffffffd8;
  sqlite3 *local_18;
  
  if (0 < *(int *)(in_RDI + 0x14)) {
    local_18 = *(sqlite3 **)(in_RDI + 0x20);
    db_00 = (sqlite3 *)(*(long *)(in_RDI + 0x20) + (long)(*(int *)(in_RDI + 0x14) + -1) * 0x38);
    while( true ) {
      if (((ulong)local_18->pDfltColl & 0x10000) != 0) {
        sqlite3ExprDelete(db_00,(Expr *)in_stack_ffffffffffffffd8);
      }
      if (((ulong)local_18->pDfltColl & 0x300000) != 0) {
        if (((ulong)local_18->pDfltColl & 0x100000) == 0) {
          whereAndInfoDelete(db_00,(WhereAndInfo *)in_stack_ffffffffffffffd8);
        }
        else {
          whereOrInfoDelete(db_00,in_stack_ffffffffffffffd8);
        }
      }
      if (local_18 == db_00) break;
      local_18 = (sqlite3 *)&local_18->lastRowid;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereClauseClear(WhereClause *pWC){
  sqlite3 *db = pWC->pWInfo->pParse->db;
  assert( pWC->nTerm>=pWC->nBase );
  if( pWC->nTerm>0 ){
    WhereTerm *a = pWC->a;
    WhereTerm *aLast = &pWC->a[pWC->nTerm-1];
#ifdef SQLITE_DEBUG
    int i;
    /* Verify that every term past pWC->nBase is virtual */
    for(i=pWC->nBase; i<pWC->nTerm; i++){
      assert( (pWC->a[i].wtFlags & TERM_VIRTUAL)!=0 );
    }
#endif
    while(1){
      assert( a->eMatchOp==0 || a->eOperator==WO_AUX );
      if( a->wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, a->pExpr);
      }
      if( a->wtFlags & (TERM_ORINFO|TERM_ANDINFO) ){
        if( a->wtFlags & TERM_ORINFO ){
          assert( (a->wtFlags & TERM_ANDINFO)==0 );
          whereOrInfoDelete(db, a->u.pOrInfo);
        }else{
          assert( (a->wtFlags & TERM_ANDINFO)!=0 );
          whereAndInfoDelete(db, a->u.pAndInfo);
        }
      }
      if( a==aLast ) break;
      a++;
    }
  }
}